

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-scanner.hpp
# Opt level: O2

void __thiscall yactfr::internal::StrScanner::save(StrScanner *this)

{
  _tStackFrame local_18;
  
  local_18.at = this->_at;
  local_18.lineBegin = this->_lineBegin;
  local_18.nbLines = this->_nbLines;
  std::
  vector<yactfr::internal::StrScanner::_tStackFrame,_std::allocator<yactfr::internal::StrScanner::_tStackFrame>_>
  ::emplace_back<yactfr::internal::StrScanner::_tStackFrame>(&this->_stack,&local_18);
  return;
}

Assistant:

void save()
    {
        _stack.push_back({_at, _lineBegin, _nbLines});
    }